

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O0

IMAGE_IMPORT_BY_NAME * __thiscall ImportedFuncWrapper::getImportByNamePtr(ImportedFuncWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  BYTE *ptr;
  uint64_t offset;
  ImportedFuncWrapper *pIStack_18;
  bool isOk;
  ImportedFuncWrapper *this_local;
  
  offset._7_1_ = 0;
  pIStack_18 = this;
  ptr = (BYTE *)ExeElementWrapper::getNumValue
                          ((ExeElementWrapper *)this,0,(bool *)((long)&offset + 7));
  if (((offset._7_1_ & 1) == 0) || (ptr == (BYTE *)0xffffffffffffffff)) {
    ptr = (BYTE *)ExeElementWrapper::getNumValue
                            ((ExeElementWrapper *)this,1,(bool *)((long)&offset + 7));
  }
  if ((offset._7_1_ & 1) == 0) {
    this_local = (ImportedFuncWrapper *)0x0;
  }
  else {
    pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar1,ptr,2,4,0);
    this_local = (ImportedFuncWrapper *)CONCAT44(extraout_var,iVar2);
  }
  return (IMAGE_IMPORT_BY_NAME *)this_local;
}

Assistant:

IMAGE_IMPORT_BY_NAME* ImportedFuncWrapper::getImportByNamePtr()
{
    bool isOk = false;
    uint64_t offset = this->getNumValue(ImportedFuncWrapper::ORIG_THUNK, &isOk);
    if (!isOk || offset == INVALID_ADDR) {
        offset = this->getNumValue(ImportedFuncWrapper::THUNK, &isOk);
    }
    if (!isOk) return NULL;
    BYTE *ptr = this->m_Exe->getContentAt(offset, Executable::RVA, sizeof(IMAGE_IMPORT_BY_NAME));
    return (IMAGE_IMPORT_BY_NAME*) ptr;
}